

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

aiNode * __thiscall aiNode::FindNode(aiNode *this,char *name)

{
  uint uVar1;
  aiNode **ppaVar2;
  int iVar3;
  uint i;
  ulong uVar4;
  
  iVar3 = strcmp((this->mName).data,name);
  if (iVar3 != 0) {
    uVar1 = this->mNumChildren;
    ppaVar2 = this->mChildren;
    uVar4 = 0;
    do {
      if (uVar1 == uVar4) {
        return (aiNode *)0x0;
      }
      this = FindNode(ppaVar2[uVar4],name);
      uVar4 = uVar4 + 1;
    } while (this == (aiNode *)0x0);
  }
  return this;
}

Assistant:

aiNode *aiNode::FindNode(const char* name) {
    if (!::strcmp(mName.data, name))return this;
    for (unsigned int i = 0; i < mNumChildren; ++i)
    {
        aiNode* const p = mChildren[i]->FindNode(name);
        if (p) {
            return p;
        }
    }
    // there is definitely no sub-node with this name
    return nullptr;
}